

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

UniValue * JSONRPCRequestObj(string *strMethod,UniValue *params,UniValue *id)

{
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *request;
  UniValue *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  UniValue *in_stack_fffffffffffffd98;
  UniValue *this;
  UniValue *val;
  UniValue *in_stack_fffffffffffffdb8;
  UniValue *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 uVar1;
  allocator<char> local_20c;
  allocator<char> local_20b;
  allocator<char> local_20a;
  allocator<char> local_209 [481];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  val = (UniValue *)&stack0xffffffffffffffd8;
  this = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffd90);
  UniValue::UniValue(in_stack_fffffffffffffd98,(VType)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                     in_stack_fffffffffffffd88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0,
             (allocator<char> *)in_stack_fffffffffffffdb8);
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffdb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8,val);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0,
             (allocator<char> *)in_stack_fffffffffffffdb8);
  UniValue::UniValue(this,in_RDI);
  UniValue::pushKV(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8,val);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(&local_20a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0,
             (allocator<char> *)in_stack_fffffffffffffdb8);
  UniValue::UniValue(this,in_RDI);
  UniValue::pushKV(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8,val);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(&local_20b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0,
             (allocator<char> *)in_stack_fffffffffffffdb8);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            (in_stack_fffffffffffffdc0,(char (*) [4])in_stack_fffffffffffffdb8);
  UniValue::pushKV(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8,val);
  UniValue::~UniValue(in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(&local_20c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue JSONRPCRequestObj(const std::string& strMethod, const UniValue& params, const UniValue& id)
{
    UniValue request(UniValue::VOBJ);
    request.pushKV("method", strMethod);
    request.pushKV("params", params);
    request.pushKV("id", id);
    request.pushKV("jsonrpc", "2.0");
    return request;
}